

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_and_ping(void)

{
  anon_union_8_2_13e1ed65_for_data aVar1;
  undefined1 auVar2 [16];
  int iVar3;
  __uid_t _Var4;
  uint uVar5;
  int extraout_EAX;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  __sighandler_t p_Var8;
  uv_process_options_t *loop;
  passwd *ppVar9;
  int *piVar10;
  uv_buf_t *buf;
  uv_process_options_t *loop_00;
  undefined1 *nread;
  uv_stream_t *stream;
  char *unaff_R12;
  uv_process_options_t *loop_01;
  uv_process_options_t *puVar11;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_write_t write_req;
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  uv_pipe_t in;
  undefined1 auStack_1200 [24];
  uv_buf_t uStack_11e8;
  uv_fs_t uStack_11d0;
  uv_pipe_t uStack_1010;
  uv_stdio_container_t uStack_f28;
  undefined4 uStack_f18;
  undefined4 uStack_f08;
  uv_loop_t *puStack_ef0;
  long lStack_eb8;
  uint uStack_eb0;
  int iStack_eac;
  uv_buf_t uStack_ea8;
  char acStack_e98 [16];
  uv_stdio_container_t uStack_e88;
  uv_write_t uStack_e70;
  uv_write_t uStack_da8;
  uv_stream_t uStack_ce0;
  uv_fs_t uStack_bf8;
  uv_loop_t *puStack_a38;
  uv_loop_t *puStack_a30;
  uv_loop_t *puStack_a28;
  long lStack_a20;
  long lStack_a18;
  uv_loop_t *puStack_a10;
  char cStack_9f9;
  long lStack_9f8;
  long lStack_9f0;
  uv_loop_t *puStack_9e8;
  uv_loop_t *puStack_9e0;
  uv_loop_t *apuStack_9d8 [2];
  uv_loop_t *puStack_9c8;
  cpu_set_t cStack_9c0;
  uv_loop_t *puStack_938;
  char *pcStack_930;
  uv_loop_t *puStack_928;
  uv_loop_t *puStack_920;
  long lStack_918;
  long lStack_910;
  uv_loop_t *puStack_908;
  long lStack_900;
  long lStack_8f8;
  uv_loop_t *puStack_8f0;
  long lStack_8e8;
  long lStack_8e0;
  char acStack_8ca [10];
  uv_loop_t *puStack_8c0;
  undefined1 auStack_890 [144];
  uv__io_t **ppuStack_800;
  uv_buf_t uStack_7f8;
  uv_mutex_t uStack_7e8;
  uv_write_t uStack_7c0;
  undefined1 auStack_6f8 [264];
  uv_handle_t *puStack_5f0;
  uv_buf_t uStack_5e8;
  uv_write_t uStack_5d8;
  uv_stdio_container_t uStack_510;
  int iStack_500;
  uv_loop_t *puStack_4f8;
  undefined1 auStack_4e0 [464];
  uv_loop_t *puStack_310;
  anon_union_8_2_13e1ed65_for_data aStack_308;
  uv_process_options_t *puStack_300;
  long local_2f0;
  long local_2e8;
  uv_buf_t local_2e0;
  uv_write_t local_2d0;
  uv_stdio_container_t local_208;
  undefined4 local_1f8;
  uv_loop_t *local_1f0;
  undefined1 local_1e8 [464];
  
  uStack_7f8.len = (size_t)uStack_7f8.base;
  puStack_300 = (uv_process_options_t *)0x1bdd2c;
  init_process_options("spawn_helper3",exit_cb);
  puStack_300 = (uv_process_options_t *)0x1bdd3d;
  local_2e0 = uv_buf_init("TEST",4);
  puStack_300 = (uv_process_options_t *)0x1bdd4c;
  puVar6 = uv_default_loop();
  puVar7 = (uv_loop_t *)local_1e8;
  puStack_300 = (uv_process_options_t *)0x1bdd61;
  uv_pipe_init(puVar6,(uv_pipe_t *)puVar7,0);
  puStack_300 = (uv_process_options_t *)0x1bdd66;
  puVar6 = uv_default_loop();
  aVar1.stream = (uv_stream_t *)(local_1e8 + 0xe8);
  puStack_300 = (uv_process_options_t *)0x1bdd7b;
  uv_pipe_init(puVar6,(uv_pipe_t *)aVar1.stream,0);
  options.stdio = &local_208;
  local_208.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_1f8 = 0x21;
  options.stdio_count = 2;
  puStack_300 = (uv_process_options_t *)0x1bddb5;
  local_208.data.stream = aVar1.stream;
  local_1f0 = puVar7;
  puVar6 = uv_default_loop();
  puStack_300 = (uv_process_options_t *)0x1bddc7;
  iVar3 = uv_spawn(puVar6,&process,&options);
  local_2d0.data = (void *)(long)iVar3;
  local_2f0 = 0;
  if (local_2d0.data == (void *)0x0) {
    puStack_300 = (uv_process_options_t *)0x1bddf5;
    iVar3 = uv_process_kill(&process,0);
    local_2d0.data = (void *)(long)iVar3;
    local_2f0 = 0;
    if (local_2d0.data != (void *)0x0) goto LAB_001bdfb2;
    puStack_300 = (uv_process_options_t *)0x1bde38;
    iVar3 = uv_write(&local_2d0,(uv_stream_t *)(local_1e8 + 0xe8),&local_2e0,1,write_cb);
    local_2f0 = (long)iVar3;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001bdfc1;
    puStack_300 = (uv_process_options_t *)0x1bde73;
    iVar3 = uv_read_start((uv_stream_t *)local_1e8,on_alloc,on_read);
    local_2f0 = (long)iVar3;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001bdfd0;
    local_2f0 = (long)exit_cb_called;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001bdfdf;
    puStack_300 = (uv_process_options_t *)0x1bdebd;
    puVar6 = uv_default_loop();
    puStack_300 = (uv_process_options_t *)0x1bdec7;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    local_2f0 = (long)iVar3;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001bdfee;
    local_2f0 = 1;
    local_2e8 = (long)exit_cb_called;
    if (local_2e8 != 1) goto LAB_001bdffd;
    puStack_300 = (uv_process_options_t *)0x1bdf1f;
    iVar3 = strcmp(output,"TEST");
    local_2f0 = (long)iVar3;
    local_2e8 = 0;
    if (local_2f0 != 0) goto LAB_001be00c;
    puStack_300 = (uv_process_options_t *)0x1bdf44;
    puVar7 = uv_default_loop();
    puStack_300 = (uv_process_options_t *)0x1bdf58;
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    puStack_300 = (uv_process_options_t *)0x1bdf62;
    uv_run(puVar7,UV_RUN_DEFAULT);
    local_2f0 = 0;
    puStack_300 = (uv_process_options_t *)0x1bdf70;
    puVar6 = uv_default_loop();
    puStack_300 = (uv_process_options_t *)0x1bdf78;
    iVar3 = uv_loop_close(puVar6);
    local_2e8 = (long)iVar3;
    if (local_2f0 == local_2e8) {
      puStack_300 = (uv_process_options_t *)0x1bdf94;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_300 = (uv_process_options_t *)0x1bdfb2;
    run_test_spawn_and_ping_cold_1();
LAB_001bdfb2:
    puStack_300 = (uv_process_options_t *)0x1bdfc1;
    run_test_spawn_and_ping_cold_2();
LAB_001bdfc1:
    puStack_300 = (uv_process_options_t *)0x1bdfd0;
    run_test_spawn_and_ping_cold_3();
LAB_001bdfd0:
    puStack_300 = (uv_process_options_t *)0x1bdfdf;
    run_test_spawn_and_ping_cold_4();
LAB_001bdfdf:
    puStack_300 = (uv_process_options_t *)0x1bdfee;
    run_test_spawn_and_ping_cold_5();
LAB_001bdfee:
    puStack_300 = (uv_process_options_t *)0x1bdffd;
    run_test_spawn_and_ping_cold_6();
LAB_001bdffd:
    puStack_300 = (uv_process_options_t *)0x1be00c;
    run_test_spawn_and_ping_cold_7();
LAB_001be00c:
    puStack_300 = (uv_process_options_t *)0x1be01b;
    run_test_spawn_and_ping_cold_8();
  }
  puStack_300 = (uv_process_options_t *)run_test_spawn_same_stdout_stderr;
  run_test_spawn_and_ping_cold_9();
  puStack_300 = &options;
  auStack_6f8._240_8_ = (uv__queue *)0x1be049;
  puStack_310 = puVar7;
  aStack_308.stream = aVar1.stream;
  init_process_options("spawn_helper3",exit_cb);
  auStack_6f8._240_8_ = (uv__queue *)0x1be05a;
  uStack_5e8 = uv_buf_init("TEST",4);
  auStack_6f8._240_8_ = (uv__queue *)0x1be069;
  puVar6 = uv_default_loop();
  puVar7 = (uv_loop_t *)auStack_4e0;
  auStack_6f8._240_8_ = (uv__queue *)0x1be07e;
  uv_pipe_init(puVar6,(uv_pipe_t *)puVar7,0);
  auStack_6f8._240_8_ = (uv__queue *)0x1be083;
  puVar6 = uv_default_loop();
  aVar1.stream = (uv_stream_t *)(auStack_4e0 + 0xe8);
  auStack_6f8._240_8_ = (uv__queue *)0x1be098;
  uv_pipe_init(puVar6,(uv_pipe_t *)aVar1.stream,0);
  options.stdio = &uStack_510;
  puVar11 = &options;
  uStack_510.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  iStack_500 = 0x21;
  options.stdio_count = 2;
  auStack_6f8._240_8_ = (uv__queue *)0x1be0d2;
  uStack_510.data.stream = aVar1.stream;
  puStack_4f8 = puVar7;
  puVar6 = uv_default_loop();
  auStack_6f8._240_8_ = (uv__queue *)0x1be0e4;
  iVar3 = uv_spawn(puVar6,&process,&options);
  uStack_5d8.data = (void *)(long)iVar3;
  auStack_6f8._256_8_ = (uv_handle_t *)0x0;
  if ((uv_signal_s *)uStack_5d8.data == (uv_signal_s *)0x0) {
    auStack_6f8._240_8_ = (uv__queue *)0x1be112;
    iVar3 = uv_process_kill(&process,0);
    uStack_5d8.data = (void *)(long)iVar3;
    auStack_6f8._256_8_ = (uv_handle_t *)0x0;
    if ((uv_signal_s *)uStack_5d8.data != (uv_signal_s *)0x0) goto LAB_001be2cf;
    auStack_6f8._240_8_ = (uv__queue *)0x1be155;
    iVar3 = uv_write(&uStack_5d8,(uv_stream_t *)(auStack_4e0 + 0xe8),&uStack_5e8,1,write_cb);
    auStack_6f8._256_8_ = SEXT48(iVar3);
    puStack_5f0 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_6f8._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2de;
    auStack_6f8._240_8_ = (uv__queue *)0x1be190;
    iVar3 = uv_read_start((uv_stream_t *)auStack_4e0,on_alloc,on_read);
    auStack_6f8._256_8_ = SEXT48(iVar3);
    puStack_5f0 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_6f8._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2ed;
    auStack_6f8._256_8_ = SEXT48(exit_cb_called);
    puStack_5f0 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_6f8._256_8_ != (uv_handle_t *)0x0) goto LAB_001be2fc;
    auStack_6f8._240_8_ = (uv__queue *)0x1be1da;
    puVar6 = uv_default_loop();
    auStack_6f8._240_8_ = (uv__queue *)0x1be1e4;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    auStack_6f8._256_8_ = SEXT48(iVar3);
    puStack_5f0 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_6f8._256_8_ != (uv_handle_t *)0x0) goto LAB_001be30b;
    auStack_6f8._256_8_ = (uv_handle_t *)0x1;
    puStack_5f0 = (uv_handle_t *)(long)exit_cb_called;
    if (puStack_5f0 != (uv_handle_t *)0x1) goto LAB_001be31a;
    auStack_6f8._240_8_ = (uv__queue *)0x1be23c;
    iVar3 = strcmp(output,"TEST");
    auStack_6f8._256_8_ = SEXT48(iVar3);
    puStack_5f0 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_6f8._256_8_ != (uv_handle_t *)0x0) goto LAB_001be329;
    auStack_6f8._240_8_ = (uv__queue *)0x1be261;
    puVar7 = uv_default_loop();
    auStack_6f8._240_8_ = (uv__queue *)0x1be275;
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    auStack_6f8._240_8_ = (uv__queue *)0x1be27f;
    uv_run(puVar7,UV_RUN_DEFAULT);
    auStack_6f8._256_8_ = (uv_handle_t *)0x0;
    auStack_6f8._240_8_ = (uv__queue *)0x1be28d;
    puVar6 = uv_default_loop();
    auStack_6f8._240_8_ = (uv__queue *)0x1be295;
    iVar3 = uv_loop_close(puVar6);
    puStack_5f0 = (uv_handle_t *)(long)iVar3;
    if ((uv_handle_t *)auStack_6f8._256_8_ == puStack_5f0) {
      auStack_6f8._240_8_ = (uv__queue *)0x1be2b1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_6f8._240_8_ = (uv__queue *)0x1be2cf;
    run_test_spawn_same_stdout_stderr_cold_1();
LAB_001be2cf:
    auStack_6f8._240_8_ = (uv__queue *)0x1be2de;
    run_test_spawn_same_stdout_stderr_cold_2();
LAB_001be2de:
    auStack_6f8._240_8_ = (uv__queue *)0x1be2ed;
    run_test_spawn_same_stdout_stderr_cold_3();
LAB_001be2ed:
    auStack_6f8._240_8_ = (uv__queue *)0x1be2fc;
    run_test_spawn_same_stdout_stderr_cold_4();
LAB_001be2fc:
    auStack_6f8._240_8_ = (uv__queue *)0x1be30b;
    run_test_spawn_same_stdout_stderr_cold_5();
LAB_001be30b:
    auStack_6f8._240_8_ = (uv__queue *)0x1be31a;
    run_test_spawn_same_stdout_stderr_cold_6();
LAB_001be31a:
    auStack_6f8._240_8_ = (uv__queue *)0x1be329;
    run_test_spawn_same_stdout_stderr_cold_7();
LAB_001be329:
    auStack_6f8._240_8_ = (uv__queue *)0x1be338;
    run_test_spawn_same_stdout_stderr_cold_8();
  }
  auStack_6f8._240_8_ = run_test_spawn_closed_process_io;
  run_test_spawn_same_stdout_stderr_cold_9();
  auStack_890._128_8_ = (uv__queue *)0x1be364;
  auStack_6f8._232_8_ = puVar7;
  auStack_6f8._240_8_ = aVar1.stream;
  init_process_options("spawn_helper3",exit_cb);
  auStack_890._128_8_ = (uv__queue *)0x1be369;
  puVar6 = uv_default_loop();
  puVar7 = (uv_loop_t *)auStack_6f8;
  auStack_890._128_8_ = (uv__queue *)0x1be37e;
  uv_pipe_init(puVar6,(uv_pipe_t *)puVar7,0);
  options.stdio = (uv_stdio_container_t *)&uStack_7e8;
  loop_01 = &options;
  uStack_7e8.__data.__lock = 0x11;
  options.stdio_count = 1;
  auStack_890._128_8_ = (uv__queue *)0x1be3ac;
  uStack_7e8._8_8_ = puVar7;
  close(0);
  auStack_890._128_8_ = (uv__queue *)0x1be3b1;
  puVar6 = uv_default_loop();
  auStack_890._128_8_ = (uv__queue *)0x1be3c3;
  iVar3 = uv_spawn(puVar6,&process,&options);
  uStack_7c0.data = (void *)(long)iVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_7f8.len;
  uStack_7f8 = (uv_buf_t)(auVar2 << 0x40);
  if (uStack_7c0.data == (void *)0x0) {
    auStack_890._128_8_ = (uv__queue *)0x1be3f4;
    uStack_7f8 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    auStack_890._128_8_ = (uv__queue *)0x1be421;
    iVar3 = uv_write(&uStack_7c0,(uv_stream_t *)auStack_6f8,&uStack_7f8,1,write_cb);
    ppuStack_800 = (uv__io_t **)(long)iVar3;
    auStack_890._136_8_ = (uv__io_t **)0x0;
    if (ppuStack_800 != (uv__io_t **)0x0) goto LAB_001be51d;
    auStack_890._128_8_ = (uv__queue *)0x1be444;
    puVar6 = uv_default_loop();
    auStack_890._128_8_ = (uv__queue *)0x1be44e;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    ppuStack_800 = (uv__io_t **)(long)iVar3;
    auStack_890._136_8_ = (uv__io_t **)0x0;
    if (ppuStack_800 != (uv__io_t **)0x0) goto LAB_001be52a;
    ppuStack_800 = (uv__io_t **)0x1;
    auStack_890._136_8_ = SEXT48(exit_cb_called);
    if ((uv__io_t **)auStack_890._136_8_ != (uv__io_t **)0x1) goto LAB_001be537;
    ppuStack_800 = (uv__io_t **)0x2;
    auStack_890._136_8_ = SEXT48(close_cb_called);
    if ((uv__io_t **)auStack_890._136_8_ != (uv__io_t **)0x2) goto LAB_001be544;
    auStack_890._128_8_ = (uv__queue *)0x1be4b7;
    puVar7 = uv_default_loop();
    auStack_890._128_8_ = (uv__queue *)0x1be4cb;
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    auStack_890._128_8_ = (uv__queue *)0x1be4d5;
    uv_run(puVar7,UV_RUN_DEFAULT);
    ppuStack_800 = (uv__io_t **)0x0;
    auStack_890._128_8_ = (uv__queue *)0x1be4e3;
    puVar6 = uv_default_loop();
    auStack_890._128_8_ = (uv__queue *)0x1be4eb;
    iVar3 = uv_loop_close(puVar6);
    auStack_890._136_8_ = SEXT48(iVar3);
    if (ppuStack_800 == (uv__io_t **)auStack_890._136_8_) {
      auStack_890._128_8_ = (uv__queue *)0x1be501;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_890._128_8_ = (uv__queue *)0x1be51d;
    run_test_spawn_closed_process_io_cold_1();
LAB_001be51d:
    auStack_890._128_8_ = (uv__queue *)0x1be52a;
    run_test_spawn_closed_process_io_cold_2();
LAB_001be52a:
    auStack_890._128_8_ = (uv__queue *)0x1be537;
    run_test_spawn_closed_process_io_cold_3();
LAB_001be537:
    auStack_890._128_8_ = (uv__queue *)0x1be544;
    run_test_spawn_closed_process_io_cold_4();
LAB_001be544:
    auStack_890._128_8_ = (uv__queue *)0x1be551;
    run_test_spawn_closed_process_io_cold_5();
  }
  auStack_890._128_8_ = run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  auStack_890._128_8_ = puVar7;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset((sigset_t *)auStack_890);
  sigaddset((sigset_t *)auStack_890,0xf);
  iVar3 = pthread_sigmask(0,(sigset_t *)auStack_890,(__sigset_t *)0x0);
  if (iVar3 == 0) {
    auStack_890._0_8_ = (__sighandler_t)0xffffffffffffffff;
    p_Var8 = signal(0xf,(__sighandler_t)0x1);
    if ((__sighandler_t)auStack_890._0_8_ == p_Var8) goto LAB_001be7c7;
    puVar7 = uv_default_loop();
    iVar3 = uv_spawn(puVar7,&process,&options);
    auStack_890._0_8_ = SEXT48(iVar3);
    if ((__sighandler_t)auStack_890._0_8_ != (__sighandler_t)0x0) goto LAB_001be7d4;
    sigemptyset((sigset_t *)auStack_890);
    sigaddset((sigset_t *)auStack_890,0xf);
    iVar3 = pthread_sigmask(1,(sigset_t *)auStack_890,(__sigset_t *)0x0);
    if (iVar3 != 0) goto LAB_001be7e1;
    auStack_890._0_8_ = (__sighandler_t)0xffffffffffffffff;
    p_Var8 = signal(0xf,(__sighandler_t)0x0);
    if ((__sighandler_t)auStack_890._0_8_ == p_Var8) goto LAB_001be7ee;
    iVar3 = uv_kill(process.pid,0);
    auStack_890._0_8_ = SEXT48(iVar3);
    if ((__sighandler_t)auStack_890._0_8_ != (__sighandler_t)0x0) goto LAB_001be7fb;
    iVar3 = uv_kill(process.pid,0xf);
    auStack_890._0_8_ = SEXT48(iVar3);
    if ((__sighandler_t)auStack_890._0_8_ != (__sighandler_t)0x0) goto LAB_001be808;
    puVar7 = uv_default_loop();
    iVar3 = uv_run(puVar7,UV_RUN_DEFAULT);
    auStack_890._0_8_ = SEXT48(iVar3);
    if ((__sighandler_t)auStack_890._0_8_ != (__sighandler_t)0x0) goto LAB_001be815;
    auStack_890._0_8_ = (__sighandler_t)0x1;
    if (exit_cb_called != 1) goto LAB_001be822;
    auStack_890._0_8_ = (__sighandler_t)0x1;
    if (close_cb_called != 1) goto LAB_001be82f;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    auStack_890._0_8_ = (__sighandler_t)0x0;
    puVar7 = uv_default_loop();
    iVar3 = uv_loop_close(puVar7);
    if ((__sighandler_t)auStack_890._0_8_ == (__sighandler_t)(long)iVar3) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001be7c7:
    run_test_kill_cold_11();
LAB_001be7d4:
    run_test_kill_cold_2();
LAB_001be7e1:
    run_test_kill_cold_3();
LAB_001be7ee:
    run_test_kill_cold_10();
LAB_001be7fb:
    run_test_kill_cold_4();
LAB_001be808:
    run_test_kill_cold_5();
LAB_001be815:
    run_test_kill_cold_6();
LAB_001be822:
    run_test_kill_cold_7();
LAB_001be82f:
    loop = (uv_process_options_t *)auStack_890;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  puStack_8f0 = (uv_loop_t *)0x1be859;
  puStack_8c0 = (uv_loop_t *)loop;
  _Var4 = getuid();
  if (_Var4 != 0) {
    puStack_8f0 = (uv_loop_t *)0x1bea18;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  puStack_8f0 = (uv_loop_t *)0x1be874;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  puStack_8f0 = (uv_loop_t *)0x1be880;
  ppVar9 = getpwnam("nobody");
  if (ppVar9 == (passwd *)0x0) {
    puStack_8f0 = (uv_loop_t *)0x1bea2b;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001bea2b:
    puStack_8f0 = (uv_loop_t *)0x1bea38;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001bea38:
    puStack_8f0 = (uv_loop_t *)0x1bea45;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001bea45:
    puStack_8f0 = (uv_loop_t *)0x1bea52;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001bea52:
    puStack_8f0 = (uv_loop_t *)0x1bea5f;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar9->pw_uid;
    loop = &options;
    options.gid = ppVar9->pw_gid;
    puVar11 = (uv_process_options_t *)0x1f7b28;
    unaff_R12 = acStack_8ca;
    puStack_8f0 = (uv_loop_t *)0x1be8c8;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar9->pw_uid);
    loop_01 = (uv_process_options_t *)&stack0xfffffffffffff72c;
    puStack_8f0 = (uv_loop_t *)0x1be8e3;
    snprintf((char *)loop_01,10,"%d",(ulong)ppVar9->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)loop_01;
    options.flags = 3;
    puStack_8f0 = (uv_loop_t *)0x1be908;
    puVar7 = uv_default_loop();
    puStack_8f0 = (uv_loop_t *)0x1be91a;
    iVar3 = uv_spawn(puVar7,&process,&options);
    if (iVar3 == -0xd) {
      puStack_8f0 = (uv_loop_t *)0x1bea1f;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_8e0 = (long)iVar3;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_001bea2b;
    puStack_8f0 = (uv_loop_t *)0x1be946;
    puVar7 = uv_default_loop();
    puStack_8f0 = (uv_loop_t *)0x1be950;
    iVar3 = uv_run(puVar7,UV_RUN_DEFAULT);
    lStack_8e0 = (long)iVar3;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_001bea38;
    lStack_8e0 = 1;
    lStack_8e8 = (long)exit_cb_called;
    if (lStack_8e8 != 1) goto LAB_001bea45;
    lStack_8e0 = 1;
    lStack_8e8 = (long)close_cb_called;
    if (lStack_8e8 != 1) goto LAB_001bea52;
    puStack_8f0 = (uv_loop_t *)0x1be9b9;
    loop_01 = (uv_process_options_t *)uv_default_loop();
    loop = (uv_process_options_t *)0x0;
    puStack_8f0 = (uv_loop_t *)0x1be9cf;
    uv_walk((uv_loop_t *)loop_01,close_walk_cb,(void *)0x0);
    puStack_8f0 = (uv_loop_t *)0x1be9d9;
    uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    lStack_8e0 = 0;
    puStack_8f0 = (uv_loop_t *)0x1be9e7;
    puVar7 = uv_default_loop();
    puStack_8f0 = (uv_loop_t *)0x1be9ef;
    iVar3 = uv_loop_close(puVar7);
    lStack_8e8 = (long)iVar3;
    if (lStack_8e0 == lStack_8e8) {
      puStack_8f0 = (uv_loop_t *)0x1bea05;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_8f0 = (uv_loop_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  puStack_908 = (uv_loop_t *)0x1bea76;
  puStack_8f0 = (uv_loop_t *)loop;
  _Var4 = getuid();
  if (_Var4 == 0) {
    puStack_908 = (uv_loop_t *)0x1bea86;
    puVar7 = (uv_loop_t *)getpwnam("nobody");
    if (puVar7 == (uv_loop_t *)0x0) goto LAB_001bec15;
    puStack_908 = (uv_loop_t *)0x1bea9a;
    iVar3 = setgid(*(__gid_t *)((long)&(puVar7->handle_queue).next + 4));
    lStack_8f8 = (long)iVar3;
    lStack_900 = 0;
    loop = (uv_process_options_t *)puVar7;
    if (lStack_8f8 != 0) goto LAB_001bec1a;
    puStack_908 = (uv_loop_t *)0x1beac0;
    iVar3 = setuid(*(__uid_t *)&(puVar7->handle_queue).next);
    lStack_8f8 = (long)iVar3;
    lStack_900 = 0;
    if (lStack_8f8 == 0) goto LAB_001beade;
  }
  else {
LAB_001beade:
    puStack_908 = (uv_loop_t *)0x1beaf1;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    puStack_908 = (uv_loop_t *)0x1beb0e;
    puVar7 = uv_default_loop();
    puStack_908 = (uv_loop_t *)0x1beb20;
    iVar3 = uv_spawn(puVar7,&process,&options);
    lStack_8f8 = (long)iVar3;
    lStack_900 = -1;
    if (lStack_8f8 == -1) {
      puStack_908 = (uv_loop_t *)0x1beb43;
      puVar7 = uv_default_loop();
      puStack_908 = (uv_loop_t *)0x1beb4d;
      iVar3 = uv_run(puVar7,UV_RUN_DEFAULT);
      lStack_8f8 = (long)iVar3;
      lStack_900 = 0;
      if (lStack_8f8 != 0) goto LAB_001bebee;
      lStack_8f8 = (long)close_cb_called;
      lStack_900 = 0;
      if (lStack_8f8 != 0) goto LAB_001bebfb;
      puStack_908 = (uv_loop_t *)0x1beb8f;
      loop = (uv_process_options_t *)uv_default_loop();
      puStack_908 = (uv_loop_t *)0x1beba3;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      puStack_908 = (uv_loop_t *)0x1bebad;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      lStack_8f8 = 0;
      puStack_908 = (uv_loop_t *)0x1bebbb;
      puVar7 = uv_default_loop();
      puStack_908 = (uv_loop_t *)0x1bebc3;
      iVar3 = uv_loop_close(puVar7);
      lStack_900 = (long)iVar3;
      if (lStack_8f8 == lStack_900) {
        puStack_908 = (uv_loop_t *)0x1bebd9;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_908 = (uv_loop_t *)0x1bebee;
      run_test_spawn_setuid_fails_cold_3();
LAB_001bebee:
      puStack_908 = (uv_loop_t *)0x1bebfb;
      run_test_spawn_setuid_fails_cold_4();
LAB_001bebfb:
      puStack_908 = (uv_loop_t *)0x1bec08;
      run_test_spawn_setuid_fails_cold_5();
    }
    puStack_908 = (uv_loop_t *)0x1bec15;
    run_test_spawn_setuid_fails_cold_6();
LAB_001bec15:
    puStack_908 = (uv_loop_t *)0x1bec1a;
    run_test_spawn_setuid_fails_cold_7();
LAB_001bec1a:
    puStack_908 = (uv_loop_t *)0x1bec27;
    run_test_spawn_setuid_fails_cold_1();
  }
  puStack_908 = (uv_loop_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_920 = (uv_loop_t *)0x1bec3e;
  puStack_908 = (uv_loop_t *)loop;
  _Var4 = getuid();
  if (_Var4 == 0) {
    puStack_920 = (uv_loop_t *)0x1bec4e;
    puVar7 = (uv_loop_t *)getpwnam("nobody");
    if (puVar7 == (uv_loop_t *)0x0) goto LAB_001beddd;
    puStack_920 = (uv_loop_t *)0x1bec62;
    iVar3 = setgid(*(__gid_t *)((long)&(puVar7->handle_queue).next + 4));
    lStack_910 = (long)iVar3;
    lStack_918 = 0;
    loop = (uv_process_options_t *)puVar7;
    if (lStack_910 != 0) goto LAB_001bede2;
    puStack_920 = (uv_loop_t *)0x1bec88;
    iVar3 = setuid(*(__uid_t *)&(puVar7->handle_queue).next);
    lStack_910 = (long)iVar3;
    lStack_918 = 0;
    if (lStack_910 == 0) goto LAB_001beca6;
  }
  else {
LAB_001beca6:
    puStack_920 = (uv_loop_t *)0x1becb9;
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_920 = (uv_loop_t *)0x1becd6;
    puVar7 = uv_default_loop();
    puStack_920 = (uv_loop_t *)0x1bece8;
    iVar3 = uv_spawn(puVar7,&process,&options);
    lStack_910 = (long)iVar3;
    lStack_918 = -1;
    if (lStack_910 == -1) {
      puStack_920 = (uv_loop_t *)0x1bed0b;
      puVar7 = uv_default_loop();
      puStack_920 = (uv_loop_t *)0x1bed15;
      iVar3 = uv_run(puVar7,UV_RUN_DEFAULT);
      lStack_910 = (long)iVar3;
      lStack_918 = 0;
      if (lStack_910 != 0) goto LAB_001bedb6;
      lStack_910 = (long)close_cb_called;
      lStack_918 = 0;
      if (lStack_910 != 0) goto LAB_001bedc3;
      puStack_920 = (uv_loop_t *)0x1bed57;
      loop = (uv_process_options_t *)uv_default_loop();
      puStack_920 = (uv_loop_t *)0x1bed6b;
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      puStack_920 = (uv_loop_t *)0x1bed75;
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      lStack_910 = 0;
      puStack_920 = (uv_loop_t *)0x1bed83;
      puVar7 = uv_default_loop();
      puStack_920 = (uv_loop_t *)0x1bed8b;
      iVar3 = uv_loop_close(puVar7);
      lStack_918 = (long)iVar3;
      if (lStack_910 == lStack_918) {
        puStack_920 = (uv_loop_t *)0x1beda1;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_920 = (uv_loop_t *)0x1bedb6;
      run_test_spawn_setgid_fails_cold_3();
LAB_001bedb6:
      puStack_920 = (uv_loop_t *)0x1bedc3;
      run_test_spawn_setgid_fails_cold_4();
LAB_001bedc3:
      puStack_920 = (uv_loop_t *)0x1bedd0;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_920 = (uv_loop_t *)0x1beddd;
    run_test_spawn_setgid_fails_cold_6();
LAB_001beddd:
    puStack_920 = (uv_loop_t *)0x1bede2;
    run_test_spawn_setgid_fails_cold_7();
LAB_001bede2:
    puStack_920 = (uv_loop_t *)0x1bedef;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_920 = (uv_loop_t *)run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  puStack_9e8 = (uv_loop_t *)0x1bee0f;
  puStack_938 = (uv_loop_t *)loop;
  pcStack_930 = unaff_R12;
  puStack_928 = (uv_loop_t *)loop_01;
  puStack_920 = (uv_loop_t *)puVar11;
  uVar5 = uv_cpumask_size();
  if ((int)uVar5 < 1) {
    puStack_9e8 = (uv_loop_t *)0x1beff8;
    run_test_spawn_affinity_cold_1();
LAB_001beff8:
    puStack_9e8 = (uv_loop_t *)0x1bf005;
    run_test_spawn_affinity_cold_2();
LAB_001bf005:
    puStack_9e8 = (uv_loop_t *)0x1bf012;
    run_test_spawn_affinity_cold_3();
    loop_00 = loop;
LAB_001bf012:
    puVar7 = (uv_loop_t *)loop_01;
    puStack_9e8 = (uv_loop_t *)0x1bf017;
    run_test_spawn_affinity_cold_9();
LAB_001bf017:
    puStack_9e8 = (uv_loop_t *)0x1bf01c;
    run_test_spawn_affinity_cold_4();
LAB_001bf01c:
    puStack_9e8 = (uv_loop_t *)0x1bf021;
    run_test_spawn_affinity_cold_5();
LAB_001bf021:
    puStack_9e8 = (uv_loop_t *)0x1bf026;
    run_test_spawn_affinity_cold_6();
LAB_001bf026:
    puStack_9e8 = (uv_loop_t *)0x1bf02b;
    run_test_spawn_affinity_cold_7();
  }
  else {
    loop = (uv_process_options_t *)(ulong)uVar5;
    cStack_9c0.__bits[0xe] = 0;
    cStack_9c0.__bits[0xf] = 0;
    cStack_9c0.__bits[0xc] = 0;
    cStack_9c0.__bits[0xd] = 0;
    cStack_9c0.__bits[10] = 0;
    cStack_9c0.__bits[0xb] = 0;
    cStack_9c0.__bits[8] = 0;
    cStack_9c0.__bits[9] = 0;
    cStack_9c0.__bits[6] = 0;
    cStack_9c0.__bits[7] = 0;
    cStack_9c0.__bits[4] = 0;
    cStack_9c0.__bits[5] = 0;
    cStack_9c0.__bits[2] = 0;
    cStack_9c0.__bits[3] = 0;
    cStack_9c0.__bits[0] = 0;
    cStack_9c0.__bits[1] = 0;
    loop_01 = (uv_process_options_t *)0x0;
    puStack_9e8 = (uv_loop_t *)0x1bee4f;
    iVar3 = sched_getaffinity(0,0x80,&cStack_9c0);
    if (iVar3 != 0) {
      puStack_9e8 = (uv_loop_t *)0x1bee58;
      piVar10 = __errno_location();
      loop_01 = (uv_process_options_t *)(long)*piVar10;
    }
    puStack_9e0 = (uv_loop_t *)0x0;
    apuStack_9d8[0] = (uv_loop_t *)loop_01;
    if ((uv_loop_t *)loop_01 != (uv_loop_t *)0x0) goto LAB_001beff8;
    loop = (uv_process_options_t *)(ulong)uVar5;
    puVar7 = (uv_loop_t *)0x0;
    do {
      if ((puVar7 < (uv_loop_t *)0x400) &&
         (puVar6 = puVar7,
         (cStack_9c0.__bits[(ulong)puVar7 >> 6] >> ((ulong)puVar7 & 0x3f) & 1) != 0)) break;
      puVar7 = (uv_loop_t *)((long)&puVar7->data + 1);
      puVar6 = (uv_loop_t *)loop;
    } while ((uv_loop_t *)loop != puVar7);
    puVar11 = (uv_process_options_t *)((ulong)puVar6 & 0xffffffff);
    puStack_9e0 = (uv_loop_t *)loop;
    apuStack_9d8[0] = (uv_loop_t *)puVar11;
    if (loop <= puVar11) goto LAB_001bf005;
    puStack_9e8 = (uv_loop_t *)0x1beed8;
    snprintf((char *)apuStack_9d8,0xb,"%d",puVar11);
    puStack_9e8 = (uv_loop_t *)0x1beeeb;
    init_process_options("spawn_helper_affinity",exit_cb);
    puStack_9e8 = (uv_loop_t *)0x1beef8;
    puVar7 = (uv_loop_t *)calloc((size_t)loop,1);
    loop_00 = loop;
    if (puVar7 == (uv_loop_t *)0x0) goto LAB_001bf012;
    *(undefined1 *)((long)((uv_loop_t *)puVar11)->reserved + (long)(puVar7->reserved + -0xe)) = 1;
    loop_00 = &options;
    options.cpumask = (char *)puVar7;
    options.cpumask_size = (size_t)loop;
    options.args[2] = (char *)apuStack_9d8;
    options.args[3] = "dummy";
    puStack_9e8 = (uv_loop_t *)0x1bef40;
    puVar6 = uv_default_loop();
    puStack_9e8 = (uv_loop_t *)0x1bef52;
    iVar3 = uv_spawn(puVar6,&process,&options);
    if (iVar3 != 0) goto LAB_001bf017;
    puStack_9e8 = (uv_loop_t *)0x1bef5f;
    puVar6 = uv_default_loop();
    puStack_9e8 = (uv_loop_t *)0x1bef69;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_001bf01c;
    if (exit_cb_called != 1) goto LAB_001bf021;
    if (close_cb_called != 1) goto LAB_001bf026;
    puStack_9e8 = (uv_loop_t *)0x1bef93;
    free(puVar7);
    puStack_9e8 = (uv_loop_t *)0x1bef98;
    loop_00 = (uv_process_options_t *)uv_default_loop();
    puStack_9e8 = (uv_loop_t *)0x1befac;
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    puStack_9e8 = (uv_loop_t *)0x1befb6;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    puStack_9e0 = (uv_loop_t *)0x0;
    puStack_9e8 = (uv_loop_t *)0x1befc3;
    puVar6 = uv_default_loop();
    puStack_9e8 = (uv_loop_t *)0x1befcb;
    iVar3 = uv_loop_close(puVar6);
    puStack_9c8 = (uv_loop_t *)(long)iVar3;
    if (puStack_9e0 == puStack_9c8) {
      puStack_9e8 = (uv_loop_t *)0x1befe2;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_9e8 = (uv_loop_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  puStack_a10 = (uv_loop_t *)0x1bf042;
  puStack_9e8 = (uv_loop_t *)loop_00;
  iVar3 = uv_cpumask_size();
  if (iVar3 < 1) {
    puStack_a10 = (uv_loop_t *)0x1bf101;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001bf101:
    puStack_a10 = (uv_loop_t *)0x1bf106;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001bf106:
    puStack_a10 = (uv_loop_t *)0x1bf10b;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    puStack_a10 = (uv_loop_t *)0x1bf05d;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_9f9;
    cStack_9f9 = '\0';
    options.cpumask_size = 0;
    loop_00 = &options;
    puStack_a10 = (uv_loop_t *)0x1bf083;
    puVar6 = uv_default_loop();
    puStack_a10 = (uv_loop_t *)0x1bf095;
    iVar3 = uv_spawn(puVar6,&process,&options);
    if (iVar3 != -0x16) goto LAB_001bf101;
    if (exit_cb_called != 0) goto LAB_001bf106;
    puStack_a10 = (uv_loop_t *)0x1bf0a8;
    loop_00 = (uv_process_options_t *)uv_default_loop();
    puStack_a10 = (uv_loop_t *)0x1bf0bc;
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    puStack_a10 = (uv_loop_t *)0x1bf0c6;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    lStack_9f0 = 0;
    puStack_a10 = (uv_loop_t *)0x1bf0d4;
    puVar6 = uv_default_loop();
    puStack_a10 = (uv_loop_t *)0x1bf0dc;
    iVar3 = uv_loop_close(puVar6);
    lStack_9f8 = (long)iVar3;
    if (lStack_9f0 == lStack_9f8) {
      puStack_a10 = (uv_loop_t *)0x1bf0f4;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_a10 = (uv_loop_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_a28 = (uv_loop_t *)0x1bf12d;
  puStack_a10 = (uv_loop_t *)loop_00;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_a28 = (uv_loop_t *)0x1bf132;
  puVar6 = uv_default_loop();
  puStack_a28 = (uv_loop_t *)0x1bf148;
  iVar3 = uv_spawn(puVar6,&process,&options);
  lStack_a18 = (long)iVar3;
  lStack_a20 = 0;
  if (lStack_a18 == 0) {
    puStack_a28 = (uv_loop_t *)0x1bf16b;
    puVar6 = uv_default_loop();
    puStack_a28 = (uv_loop_t *)0x1bf175;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    lStack_a18 = (long)iVar3;
    lStack_a20 = 0;
    if (lStack_a18 != 0) goto LAB_001bf286;
    puStack_a28 = (uv_loop_t *)0x1bf19f;
    iVar3 = uv_is_closing((uv_handle_t *)&process);
    lStack_a18 = (long)iVar3;
    lStack_a20 = 0;
    if (lStack_a18 != 0) goto LAB_001bf293;
    puStack_a28 = (uv_loop_t *)0x1bf1cb;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puStack_a28 = (uv_loop_t *)0x1bf1d0;
    puVar6 = uv_default_loop();
    puStack_a28 = (uv_loop_t *)0x1bf1da;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    lStack_a18 = (long)iVar3;
    lStack_a20 = 0;
    if (lStack_a18 != 0) goto LAB_001bf2a0;
    lStack_a18 = 1;
    puStack_a28 = (uv_loop_t *)0x1bf20d;
    iVar3 = uv_is_closing((uv_handle_t *)&process);
    lStack_a20 = (long)iVar3;
    if (lStack_a18 != lStack_a20) goto LAB_001bf2ad;
    puStack_a28 = (uv_loop_t *)0x1bf227;
    loop_00 = (uv_process_options_t *)uv_default_loop();
    puStack_a28 = (uv_loop_t *)0x1bf23b;
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    puStack_a28 = (uv_loop_t *)0x1bf245;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    lStack_a18 = 0;
    puStack_a28 = (uv_loop_t *)0x1bf253;
    puVar6 = uv_default_loop();
    puStack_a28 = (uv_loop_t *)0x1bf25b;
    iVar3 = uv_loop_close(puVar6);
    lStack_a20 = (long)iVar3;
    if (lStack_a18 == lStack_a20) {
      puStack_a28 = (uv_loop_t *)0x1bf271;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_a28 = (uv_loop_t *)0x1bf286;
    run_test_spawn_auto_unref_cold_1();
LAB_001bf286:
    puStack_a28 = (uv_loop_t *)0x1bf293;
    run_test_spawn_auto_unref_cold_2();
LAB_001bf293:
    puStack_a28 = (uv_loop_t *)0x1bf2a0;
    run_test_spawn_auto_unref_cold_3();
LAB_001bf2a0:
    puStack_a28 = (uv_loop_t *)0x1bf2ad;
    run_test_spawn_auto_unref_cold_4();
LAB_001bf2ad:
    puStack_a28 = (uv_loop_t *)0x1bf2ba;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_a28 = (uv_loop_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  builtin_strncpy(acStack_e98,"/dev/null",10);
  puStack_a38 = (uv_loop_t *)loop_00;
  puStack_a30 = puVar7;
  puStack_a28 = (uv_loop_t *)puVar11;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_bf8,acStack_e98,2,0,(uv_fs_cb)0x0);
  uStack_ce0.data = (void *)(long)iVar3;
  uStack_da8.data = (void *)0x0;
  if (uStack_ce0.data == (void *)0x0) {
    loop_00 = (uv_process_options_t *)(ulong)(uint)uStack_bf8.result;
    uStack_eb0 = (uint)uStack_bf8.result;
    init_process_options("spawn_helper8",exit_cb);
    puVar7 = uv_default_loop();
    iVar3 = uv_pipe_init(puVar7,(uv_pipe_t *)&uStack_ce0,0);
    uStack_da8.data = (void *)(long)iVar3;
    uStack_e70.data = (void *)0x0;
    if (uStack_da8.data != (void *)0x0) goto LAB_001bf5e0;
    options.stdio = &uStack_e88;
    uStack_e88.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_e88.data.stream = &uStack_ce0;
    iStack_eac = dup((uint)uStack_bf8.result);
    puVar7 = uv_default_loop();
    iVar3 = uv_spawn(puVar7,&process,&options);
    uStack_da8.data = (void *)(long)iVar3;
    uStack_e70.data = (void *)0x0;
    if (uStack_da8.data != (void *)0x0) goto LAB_001bf5f2;
    uStack_ea8 = uv_buf_init((char *)&uStack_eb0,4);
    iVar3 = uv_write(&uStack_da8,&uStack_ce0,&uStack_ea8,1,write_null_cb);
    uStack_e70.data = (void *)(long)iVar3;
    if (uStack_e70.data != (void *)0x0) goto LAB_001bf604;
    uStack_ea8 = uv_buf_init((char *)&iStack_eac,4);
    iVar3 = uv_write(&uStack_e70,&uStack_ce0,&uStack_ea8,1,write_cb);
    lStack_eb8 = 0;
    if (iVar3 != 0) goto LAB_001bf613;
    puVar7 = uv_default_loop();
    iVar3 = uv_run(puVar7,UV_RUN_DEFAULT);
    lStack_eb8 = 0;
    if (iVar3 != 0) goto LAB_001bf622;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,&uStack_bf8,uStack_eb0,(uv_fs_cb)0x0);
    lStack_eb8 = 0;
    if (iVar3 != 0) goto LAB_001bf631;
    lStack_eb8 = (long)exit_cb_called;
    if (lStack_eb8 != 1) goto LAB_001bf640;
    lStack_eb8 = (long)close_cb_called;
    if (lStack_eb8 != 2) goto LAB_001bf64f;
    loop_00 = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop_00,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    puVar7 = uv_default_loop();
    iVar3 = uv_loop_close(puVar7);
    lStack_eb8 = (long)iVar3;
    if (lStack_eb8 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001bf5e0:
    run_test_spawn_fs_open_cold_2();
LAB_001bf5f2:
    run_test_spawn_fs_open_cold_3();
LAB_001bf604:
    run_test_spawn_fs_open_cold_4();
LAB_001bf613:
    run_test_spawn_fs_open_cold_5();
LAB_001bf622:
    run_test_spawn_fs_open_cold_6();
LAB_001bf631:
    run_test_spawn_fs_open_cold_7();
LAB_001bf640:
    run_test_spawn_fs_open_cold_8();
LAB_001bf64f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar3 = (int)&lStack_eb8;
  run_test_spawn_fs_open_cold_10();
  if (iVar3 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_ef0 = (uv_loop_t *)loop_00;
  uStack_11e8 = uv_buf_init("",1);
  iVar3 = uv_pipe((uv_os_fd_t *)(auStack_1200 + 0x10),0,0);
  if (iVar3 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_f28;
    uStack_f28.flags = UV_INHERIT_FD;
    uStack_f28.data.file = auStack_1200._16_4_;
    uStack_f18 = 0;
    uStack_f08 = 0;
    puVar7 = uv_default_loop();
    iVar3 = uv_spawn(puVar7,&process,&options);
    uStack_11d0.data = (void *)(long)iVar3;
    uStack_1010.data = (void *)0x0;
    if ((uv_handle_t *)uStack_11d0.data != (uv_handle_t *)0x0) goto LAB_001bfb1b;
    uv_unref((uv_handle_t *)&process);
    puVar7 = uv_default_loop();
    iVar3 = uv_pipe_init(puVar7,&uStack_1010,0);
    uStack_11d0.data = (void *)(long)iVar3;
    auStack_1200._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_11d0.data != (uv_handle_t *)0x0) goto LAB_001bfb2d;
    iVar3 = uv_pipe_open(&uStack_1010,auStack_1200._16_4_);
    uStack_11d0.data = (void *)(long)iVar3;
    auStack_1200._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_11d0.data != (uv_handle_t *)0x0) goto LAB_001bfb3c;
    auStack_1200._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar3 = uv_read_start((uv_stream_t *)&uStack_1010,on_alloc,on_read_once);
    uStack_11d0.data = (void *)(long)iVar3;
    auStack_1200._0_8_ = (uv_loop_t *)0x0;
    if ((uv_handle_t *)uStack_11d0.data != (uv_handle_t *)0x0) goto LAB_001bfb4b;
    auStack_1200._0_8_ = (uv_loop_t *)0x1;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&uStack_11d0,auStack_1200._20_4_,&uStack_11e8,1,-1,
                        (uv_fs_cb)0x0);
    auStack_1200._8_8_ = SEXT48(iVar3);
    if (auStack_1200._0_8_ != auStack_1200._8_8_) goto LAB_001bfb5a;
    auStack_1200._0_8_ = (uv_loop_t *)0x1;
    auStack_1200._8_8_ = uStack_11d0.result;
    if ((uv_loop_t *)uStack_11d0.result != (uv_loop_t *)0x1) goto LAB_001bfb69;
    uv_fs_req_cleanup(&uStack_11d0);
    puVar7 = uv_default_loop();
    iVar3 = uv_run(puVar7,UV_RUN_ONCE);
    auStack_1200._0_8_ = SEXT48(iVar3);
    auStack_1200._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1200._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfb78;
    auStack_1200._0_8_ = (uv_loop_t *)0x1;
    auStack_1200._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_1200._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfb87;
    uv_close((uv_handle_t *)&uStack_1010,close_cb);
    auStack_1200._0_8_ = (uv_loop_t *)0x1;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,&uStack_11d0,auStack_1200._20_4_,&uStack_11e8,1,-1,
                        (uv_fs_cb)0x0);
    auStack_1200._8_8_ = SEXT48(iVar3);
    if (auStack_1200._0_8_ != auStack_1200._8_8_) goto LAB_001bfb96;
    auStack_1200._0_8_ = (uv_loop_t *)0x1;
    auStack_1200._8_8_ = uStack_11d0.result;
    if ((uv_loop_t *)uStack_11d0.result != (uv_loop_t *)0x1) goto LAB_001bfba5;
    uv_fs_req_cleanup(&uStack_11d0);
    puVar7 = uv_default_loop();
    iVar3 = uv_timer_init(puVar7,&timer);
    auStack_1200._0_8_ = SEXT48(iVar3);
    auStack_1200._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1200._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbb4;
    iVar3 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_1200._0_8_ = SEXT48(iVar3);
    auStack_1200._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1200._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbc3;
    puVar7 = uv_default_loop();
    iVar3 = uv_run(puVar7,UV_RUN_ONCE);
    if (iVar3 == 1) {
      puVar7 = uv_default_loop();
      iVar3 = uv_run(puVar7,UV_RUN_ONCE);
      auStack_1200._0_8_ = SEXT48(iVar3);
      auStack_1200._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_1200._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfc0e;
    }
    auStack_1200._0_8_ = (uv_loop_t *)0x1;
    auStack_1200._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_1200._8_8_ != (uv_loop_t *)0x1) goto LAB_001bfbd2;
    iVar3 = uv_process_kill(&process,0xf);
    auStack_1200._0_8_ = SEXT48(iVar3);
    auStack_1200._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1200._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbe1;
    iVar3 = close(auStack_1200._20_4_);
    auStack_1200._0_8_ = SEXT48(iVar3);
    auStack_1200._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1200._0_8_ != (uv_loop_t *)0x0) goto LAB_001bfbf0;
    auStack_1200._20_4_ = -1;
    puVar7 = uv_default_loop();
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    uv_run(puVar7,UV_RUN_DEFAULT);
    auStack_1200._0_8_ = (uv_loop_t *)0x0;
    puVar7 = uv_default_loop();
    iVar3 = uv_loop_close(puVar7);
    auStack_1200._8_8_ = SEXT48(iVar3);
    if (auStack_1200._0_8_ == auStack_1200._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001bfb1b:
    run_test_closed_fd_events_cold_2();
LAB_001bfb2d:
    run_test_closed_fd_events_cold_3();
LAB_001bfb3c:
    run_test_closed_fd_events_cold_4();
LAB_001bfb4b:
    run_test_closed_fd_events_cold_5();
LAB_001bfb5a:
    run_test_closed_fd_events_cold_6();
LAB_001bfb69:
    run_test_closed_fd_events_cold_7();
LAB_001bfb78:
    run_test_closed_fd_events_cold_8();
LAB_001bfb87:
    run_test_closed_fd_events_cold_9();
LAB_001bfb96:
    run_test_closed_fd_events_cold_10();
LAB_001bfba5:
    run_test_closed_fd_events_cold_11();
LAB_001bfbb4:
    run_test_closed_fd_events_cold_12();
LAB_001bfbc3:
    run_test_closed_fd_events_cold_13();
LAB_001bfbd2:
    run_test_closed_fd_events_cold_15();
LAB_001bfbe1:
    run_test_closed_fd_events_cold_16();
LAB_001bfbf0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001bfc0e:
  stream = (uv_stream_t *)auStack_1200;
  nread = auStack_1200 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop(stream);
  on_read(stream,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_and_ping) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_OK(strcmp(output, "TEST"));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}